

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterface::PrintHelpText(CommandLineInterface *this)

{
  bool bVar1;
  ostream *poVar2;
  reference ppVar3;
  iterator iVar4;
  const_iterator other;
  long *local_60;
  long local_58;
  long local_50 [2];
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_*>
  local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->executable_name_)._M_dataplus._M_p,
                      (this->executable_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," [OPTION] PROTO_FILES",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\nParse PROTO_FILES and generate output based on the options given:\n  -IPATH, --proto_path=PATH   Specify the directory in which to search for\n                              imports.  May be specified multiple times;\n                              directories will be searched in order.  If not\n                              given, the current working directory is used.\n                              If not found in any of the these directories,\n                              the --descriptor_set_in descriptors will be\n                              checked for required proto file.\n  --version                   Show version info and exit.\n  -h, --help                  Show this text and exit.\n  --encode=MESSAGE_TYPE       Read a text-format message of the given type\n                              from standard input and write it in binary\n                              to standard output.  The message type must\n                              be defined in PROTO_FILES or their imports.\n  --deterministic_output      When using --encode, ensure map fields are\n                              deterministically ordered. Note that this order\n                              is not canonical, and changes across builds or\n                              releases of protoc.\n  --decode=MESSAGE_TYPE       Read a binary message of the given type from\n                              standard input and write it in text format\n                              to standard output.  The message type must\n                              be defined in PROTO_FILES or their imports.\n  --decode_raw                Read an arbitrary protocol message from\n                              standard input and write the raw tag/value\n                              pairs in text format to standard output.  No\n                              PROTO_FILES should be given when using this\n                              flag.\n  --descriptor_set_in=FILES   Specifies a delimited list of FILES\n                              each containing a FileDescriptorSet (a\n                       ..." /* TRUNCATED STRING LITERAL */
             ,0x12bc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n  --notices                   Show notice file and exit.",0x39
            );
  if ((this->plugin_prefix_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\n  --plugin=EXECUTABLE         Specifies a plugin executable to use.\n                              Normally, protoc searches the PATH for\n                              plugins, but you may specify additional\n                              executables not in the path using this flag.\n                              Additionally, EXECUTABLE may be of the form\n                              NAME=PATH, in which case the given plugin name\n                              is mapped to the given executable even if\n                              the executable\'s own name differs."
               ,0x23a);
  }
  iVar4 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
          ::begin((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                   *)&this->generators_by_flag_name_);
  local_40.node_ = iVar4.node_;
  local_40.position_ = iVar4.position_;
  iVar4 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
          ::end((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                 *)&this->generators_by_flag_name_);
  bVar1 = absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_*>
          ::Equals(&local_40,(const_iterator)iVar4);
  if (!bVar1) {
    do {
      ppVar3 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_*>
               ::operator*(&local_40);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      poVar2 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(ppVar3->first)._M_dataplus._M_p,(ppVar3->first)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=OUT_DIR ",9);
      local_60 = local_50;
      std::__cxx11::string::_M_construct
                ((ulong)&local_60,'\x13' - (char)(ppVar3->first)._M_string_length);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_60,local_58);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,(ppVar3->second).help_text._M_dataplus._M_p,
                 (ppVar3->second).help_text._M_string_length);
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_*>
      ::increment(&local_40);
      other._12_4_ = 0;
      other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                     *)SUB128(iVar4._0_12_,0);
      other.position_ = SUB124(iVar4._0_12_,8);
      bVar1 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_*>
              ::Equals(&local_40,other);
    } while (!bVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\n  @<filename>                 Read options and filenames from file. If a\n                              relative file path is specified, the file\n                              will be searched in the working directory.\n                              The --proto_path option will not affect how\n                              this argument file is searched. Content of\n                              the file will be expanded in the position of\n                              @<filename> as in the argument list. Note\n                              that shell expansion is not applied to the\n                              content of the file (i.e., you cannot use\n                              quotes, wildcards, escapes, commands, etc.).\n                              Each line corresponds to a single argument,\n                              even if it contains spaces."
             ,0x360);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return;
}

Assistant:

void CommandLineInterface::PrintHelpText() {
  // Sorry for indentation here; line wrapping would be uglier.
  std::cout << "Usage: " << executable_name_ << " [OPTION] PROTO_FILES";
  std::cout << R"(
Parse PROTO_FILES and generate output based on the options given:
  -IPATH, --proto_path=PATH   Specify the directory in which to search for
                              imports.  May be specified multiple times;
                              directories will be searched in order.  If not
                              given, the current working directory is used.
                              If not found in any of the these directories,
                              the --descriptor_set_in descriptors will be
                              checked for required proto file.
  --version                   Show version info and exit.
  -h, --help                  Show this text and exit.
  --encode=MESSAGE_TYPE       Read a text-format message of the given type
                              from standard input and write it in binary
                              to standard output.  The message type must
                              be defined in PROTO_FILES or their imports.
  --deterministic_output      When using --encode, ensure map fields are
                              deterministically ordered. Note that this order
                              is not canonical, and changes across builds or
                              releases of protoc.
  --decode=MESSAGE_TYPE       Read a binary message of the given type from
                              standard input and write it in text format
                              to standard output.  The message type must
                              be defined in PROTO_FILES or their imports.
  --decode_raw                Read an arbitrary protocol message from
                              standard input and write the raw tag/value
                              pairs in text format to standard output.  No
                              PROTO_FILES should be given when using this
                              flag.
  --descriptor_set_in=FILES   Specifies a delimited list of FILES
                              each containing a FileDescriptorSet (a
                              protocol buffer defined in descriptor.proto).
                              The FileDescriptor for each of the PROTO_FILES
                              provided will be loaded from these
                              FileDescriptorSets. If a FileDescriptor
                              appears multiple times, the first occurrence
                              will be used.
  -oFILE,                     Writes a FileDescriptorSet (a protocol buffer,
    --descriptor_set_out=FILE defined in descriptor.proto) containing all of
                              the input files to FILE.
  --include_imports           When using --descriptor_set_out, also include
                              all dependencies of the input files in the
                              set, so that the set is self-contained.
  --include_source_info       When using --descriptor_set_out, do not strip
                              SourceCodeInfo from the FileDescriptorProto.
                              This results in vastly larger descriptors that
                              include information about the original
                              location of each decl in the source file as
                              well as surrounding comments.
  --retain_options            When using --descriptor_set_out, do not strip
                              any options from the FileDescriptorProto.
                              This results in potentially larger descriptors
                              that include information about options that were
                              only meant to be useful during compilation.
  --dependency_out=FILE       Write a dependency output file in the format
                              expected by make. This writes the transitive
                              set of input file paths to FILE
  --error_format=FORMAT       Set the format in which to print errors.
                              FORMAT may be 'gcc' (the default) or 'msvs'
                              (Microsoft Visual Studio format).
  --fatal_warnings            Make warnings be fatal (similar to -Werr in
                              gcc). This flag will make protoc return
                              with a non-zero exit code if any warnings
                              are generated.
  --print_free_field_numbers  Print the free field numbers of the messages
                              defined in the given proto files. Extension ranges
                              are counted as occupied fields numbers.
  --enable_codegen_trace      Enables tracing which parts of protoc are
                              responsible for what codegen output. Not supported
                              by all backends or on all platforms.)";
  std::cout << R"(
  --notices                   Show notice file and exit.)";
  if (!plugin_prefix_.empty()) {
    std::cout << R"(
  --plugin=EXECUTABLE         Specifies a plugin executable to use.
                              Normally, protoc searches the PATH for
                              plugins, but you may specify additional
                              executables not in the path using this flag.
                              Additionally, EXECUTABLE may be of the form
                              NAME=PATH, in which case the given plugin name
                              is mapped to the given executable even if
                              the executable's own name differs.)";
  }

  for (const auto& kv : generators_by_flag_name_) {
    // FIXME(kenton):  If the text is long enough it will wrap, which is ugly,
    //   but fixing this nicely (e.g. splitting on spaces) is probably more
    //   trouble than it's worth.
    std::cout << std::endl
              << "  " << kv.first << "=OUT_DIR "
              << std::string(19 - kv.first.size(),
                             ' ')  // Spaces for alignment.
              << kv.second.help_text;
  }
  std::cout << R"(
  @<filename>                 Read options and filenames from file. If a
                              relative file path is specified, the file
                              will be searched in the working directory.
                              The --proto_path option will not affect how
                              this argument file is searched. Content of
                              the file will be expanded in the position of
                              @<filename> as in the argument list. Note
                              that shell expansion is not applied to the
                              content of the file (i.e., you cannot use
                              quotes, wildcards, escapes, commands, etc.).
                              Each line corresponds to a single argument,
                              even if it contains spaces.)";
  std::cout << std::endl;
}